

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  vec3f eye;
  vec3f center;
  vec3f up;
  size_t sVar2;
  long lVar3;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  vec<4UL,_double> *pvVar4;
  int j;
  mat4 *pmVar5;
  mat4 *pmVar6;
  double *pdVar7;
  size_t i;
  ulong uVar8;
  byte bVar9;
  DepthBuffer zbuffer;
  TGAImage image;
  array<vec<4UL,_double>,_3UL> screen_coords;
  Model model;
  PhongShader shader;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 in_stack_fffffffffffffac0 [24];
  string local_528;
  string local_508;
  size_t in_stack_fffffffffffffb20;
  pointer in_stack_fffffffffffffb28;
  pointer in_stack_fffffffffffffb30;
  pointer in_stack_fffffffffffffb38;
  pointer in_stack_fffffffffffffb40;
  pointer in_stack_fffffffffffffb48;
  pointer in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb58 [16];
  vec4f local_498;
  mat4 local_478;
  Model local_3f8;
  PhongShader local_2f0;
  
  bVar9 = 0;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"obj/african_head.obj","");
  Model::Model(&local_3f8,&local_508,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage((TGAImage *)&stack0xfffffffffffffb40,800,800,3);
  DepthBuffer::DepthBuffer((DepthBuffer *)&stack0xfffffffffffffb18,800,800);
  pmVar6 = &local_2f0.super_IShader.uniform_ModelView;
  memset(pmVar6,0,0x180);
  local_2f0.super_IShader._vptr_IShader = (_func_int **)&PTR__IShader_0010ad30;
  memset(&local_2f0.varying_uv,0,0x138);
  eye.y = (double)in_stack_fffffffffffffb28;
  eye.x = (double)in_stack_fffffffffffffb20;
  eye.z = (double)in_stack_fffffffffffffb30;
  center.y = (double)in_stack_fffffffffffffb40;
  center.x = (double)in_stack_fffffffffffffb38;
  center.z = (double)in_stack_fffffffffffffb48;
  up.y = (double)in_stack_fffffffffffffb58._0_8_;
  up.z = (double)in_stack_fffffffffffffb58._8_8_;
  up.x = (double)in_stack_fffffffffffffb50;
  dVar10 = ::eye.x;
  dVar11 = ::eye.y;
  dVar12 = ::eye.z;
  dVar13 = ::center.x;
  dVar14 = ::center.y;
  dVar15 = ::center.z;
  dVar16 = ::up.x;
  dVar17 = ::up.y;
  dVar18 = ::up.z;
  lookat(eye,center,up);
  pmVar5 = &local_478;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar6->rows[0].data[0] = pmVar5->rows[0].data[0];
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar9 * -2 + 1) * 8);
    pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  viewport(&local_478,100,100,600,600);
  pmVar6 = &local_478;
  pmVar5 = &local_2f0.super_IShader.uniform_Viewport;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->rows[0].data[0] = pmVar6->rows[0].data[0];
    pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  operator-((vec<3UL,_double> *)&local_498,&::eye,&::center);
  dVar1 = dot<3ul,double>((vec<3UL,_double> *)&local_498,(vec<3UL,_double> *)&local_498);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  projection(-1.0 / dVar1);
  pmVar6 = &local_478;
  pmVar5 = &local_2f0.super_IShader.uniform_Projection;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->rows[0].data[0] = pmVar6->rows[0].data[0];
    pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  local_2f0.uniform_light_dir.x = light_dir.x;
  local_2f0.uniform_light_dir.y = light_dir.y;
  local_2f0.uniform_light_dir.z = light_dir.z;
  uVar8 = 0;
  while( true ) {
    pvVar4 = local_478.rows;
    sVar2 = Model::nfaces(&local_3f8);
    if (sVar2 <= uVar8) break;
    local_478.rows[2].data[2] = 0.0;
    local_478.rows[2].data[3] = 0.0;
    local_478.rows[2].data[0] = 0.0;
    local_478.rows[2].data[1] = 0.0;
    local_478.rows[1].data[2] = 0.0;
    local_478.rows[1].data[3] = 0.0;
    local_478.rows[1].data[0] = 0.0;
    local_478.rows[1].data[1] = 0.0;
    local_478.rows[0].data[2] = 0.0;
    local_478.rows[0].data[3] = 0.0;
    local_478.rows[0].data[0] = 0.0;
    local_478.rows[0].data[1] = 0.0;
    lVar3 = 0;
    do {
      PhongShader::vertex(&local_498,&local_2f0,&local_3f8,(int)uVar8,(int)lVar3);
      ((vec<4UL,_double> *)pvVar4->data)->data[2] = local_498.data[2];
      ((vec<4UL,_double> *)pvVar4->data)->data[3] = local_498.data[3];
      ((vec<4UL,_double> *)pvVar4->data)->data[0] = local_498.data[0];
      ((vec<4UL,_double> *)pvVar4->data)->data[1] = local_498.data[1];
      lVar3 = lVar3 + 1;
      pvVar4 = pvVar4 + 1;
    } while (lVar3 != 3);
    pmVar6 = &local_478;
    pdVar7 = (double *)&stack0xfffffffffffffa78;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar7 = pmVar6->rows[0].data[0];
      pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
    }
    pts._M_elems[0].data[1] = dVar11;
    pts._M_elems[0].data[0] = dVar10;
    pts._M_elems[0].data[2] = dVar12;
    pts._M_elems[0].data[3] = dVar13;
    pts._M_elems[1].data[0] = dVar14;
    pts._M_elems[1].data[1] = dVar15;
    pts._M_elems[1].data[2] = dVar16;
    pts._M_elems[1].data[3] = dVar17;
    pts._M_elems[2].data[0] = dVar18;
    pts._M_elems[2].data[1] = (double)in_stack_fffffffffffffac0._0_8_;
    pts._M_elems[2].data[2] = (double)in_stack_fffffffffffffac0._8_8_;
    pts._M_elems[2].data[3] = (double)in_stack_fffffffffffffac0._16_8_;
    triangle(&local_3f8,pts,&local_2f0.super_IShader,(TGAImage *)&stack0xfffffffffffffb40,
             (DepthBuffer *)&stack0xfffffffffffffb18);
    uVar8 = uVar8 + 1;
  }
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"output.tga","");
  __n = 1;
  TGAImage::write_tga_file((TGAImage *)&stack0xfffffffffffffb40,&local_528,true,true);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  DepthBuffer::write((DepthBuffer *)&stack0xfffffffffffffb18,0x108050,__buf,__n);
  IShader::~IShader(&local_2f0.super_IShader);
  if (in_stack_fffffffffffffb28 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffb28,
                    (long)in_stack_fffffffffffffb38 - (long)in_stack_fffffffffffffb28);
  }
  if (in_stack_fffffffffffffb40 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffb40,
                    (long)in_stack_fffffffffffffb50 - (long)in_stack_fffffffffffffb40);
  }
  Model::~Model(&local_3f8);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    // GouraudShader shader;
    PhongShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}